

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

iterator __thiscall
cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend_impl
          (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *this,iterator it,
          BuildsystemDirectoryStateType *t)

{
  iterator __position;
  ulong uVar1;
  iterator iVar2;
  ulong local_18;
  
  local_18 = it.Position;
  __position._M_current =
       (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  uVar1 = (long)__position._M_current -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar1 != ((long)(this->Data).
                      super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Data).
                      super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x2e8ba2e8ba2e8ba3) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                  ,0x99,
                  "iterator cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend_impl(iterator, T) [T = cmState::BuildsystemDirectoryStateType]"
                 );
  }
  if (local_18 <= uVar1) {
    if (__position._M_current ==
        (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->UpPositions,
                 __position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::
    vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
    ::push_back(&this->Data,t);
    iVar2.Position =
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar2.Tree = this;
    return iVar2;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                ,0x9a,
                "iterator cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend_impl(iterator, T) [T = cmState::BuildsystemDirectoryStateType]"
               );
}

Assistant:

iterator Extend_impl(iterator it, T t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(t);
    return iterator(this, this->UpPositions.size());
  }